

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O1

VectorXd __thiscall
Tools::CalculateRMSE
          (Tools *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *estimations,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *ground_truth)

{
  double *pdVar1;
  pointer pMVar2;
  long size_00;
  double *pdVar3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  double dVar6;
  Index size;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar7;
  long *in_RCX;
  ulong uVar8;
  _func_int **pp_Var9;
  long lVar10;
  DenseIndex extraout_RDX;
  DenseIndex extraout_RDX_00;
  DenseIndex extraout_RDX_01;
  DenseIndex DVar11;
  pointer pMVar12;
  Index size_3;
  long *plVar13;
  Index index_3;
  ulong uVar14;
  double dVar15;
  _func_int *p_Var16;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  VectorXd VVar19;
  VectorXd residual;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  tmp;
  DenseStorage<double,__1,__1,_1,_0> local_80;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_70;
  long *local_68;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_60;
  Scalar local_40;
  Scalar local_38;
  
  local_70 = ground_truth;
  local_68 = in_RCX;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)this,4,4,1);
  local_60.m_row = 0;
  local_60.m_col = 1;
  local_60.m_currentBlockRows = 1;
  *this->_vptr_Tools = (_func_int *)0x0;
  local_80.m_data = (double *)0x0;
  local_60.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_60,(Scalar *)&local_80);
  local_40 = 0.0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar7,&local_40);
  local_38 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar7,&local_38);
  if ((local_60.m_row + local_60.m_currentBlockRows !=
       ((local_60.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
       m_rows) || (local_60.m_col != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                  ,0x6f,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  pMVar12 = (local_70->
            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pMVar2 = (local_70->
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pMVar12 == pMVar2) || ((long)pMVar12 - (long)pMVar2 != local_68[1] - *local_68)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid estimation or ground_truth data",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    DVar11 = extraout_RDX;
  }
  else {
    pMVar12 = (local_70->
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((local_70->
        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        )._M_impl.super__Vector_impl_data._M_finish == pMVar12) {
      uVar8 = 0;
    }
    else {
      uVar14 = 0;
      do {
        lVar10 = *local_68;
        size_00 = *(long *)(lVar10 + 8 + uVar14 * 0x10);
        if (pMVar12[uVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows != size_00) {
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/CwiseBinaryOp.h"
                        ,0x84,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_80,size_00,size_00,1);
        plVar13 = (long *)(lVar10 + uVar14 * 0x10);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80,plVar13[1],
                   1);
        if (local_80.m_rows != plVar13[1]) {
          __assert_fail("rows() == other.rows() && cols() == other.cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                        ,0x1f9,
                        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
                       );
        }
        uVar8 = local_80.m_rows - (local_80.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_80.m_rows) {
          lVar10 = 0;
          do {
            pdVar3 = pMVar12[uVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data + lVar10;
            dVar15 = pdVar3[1];
            pdVar1 = (double *)(*plVar13 + lVar10 * 8);
            dVar6 = pdVar1[1];
            local_80.m_data[lVar10] = *pdVar3 - *pdVar1;
            (local_80.m_data + lVar10)[1] = dVar15 - dVar6;
            lVar10 = lVar10 + 2;
          } while (lVar10 < (long)uVar8);
        }
        if ((long)uVar8 < local_80.m_rows) {
          pdVar3 = pMVar12[uVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          lVar10 = *plVar13;
          do {
            local_80.m_data[uVar8] = pdVar3[uVar8] - *(double *)(lVar10 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (local_80.m_rows != uVar8);
        }
        if (local_80.m_rows < 0) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                        ,0xf1,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80,
                   local_80.m_rows,1);
        uVar8 = local_80.m_rows - (local_80.m_rows >> 0x3f) & 0xfffffffffffffffe;
        if (1 < local_80.m_rows) {
          lVar10 = 0;
          do {
            dVar15 = local_80.m_data[lVar10];
            dVar6 = (local_80.m_data + lVar10)[1];
            local_80.m_data[lVar10] = dVar15 * dVar15;
            (local_80.m_data + lVar10)[1] = dVar6 * dVar6;
            lVar10 = lVar10 + 2;
          } while (lVar10 < (long)uVar8);
        }
        if ((long)uVar8 < local_80.m_rows) {
          do {
            local_80.m_data[uVar8] = local_80.m_data[uVar8] * local_80.m_data[uVar8];
            uVar8 = uVar8 + 1;
          } while (local_80.m_rows != uVar8);
        }
        local_60.m_row = (Index)&local_40;
        local_60.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)this;
        Eigen::
        SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
        ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&local_60,(Matrix<double,__1,_1,_0,__1,_1> *)&local_80);
        free(local_80.m_data);
        uVar14 = (ulong)((int)uVar14 + 1);
        pMVar12 = (local_70->
                  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(local_70->
                      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar12 >> 4;
      } while (uVar14 < uVar8);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
               (Index)this[1]._vptr_Tools,1);
    auVar18._8_4_ = (int)(uVar8 >> 0x20);
    auVar18._0_8_ = uVar8;
    auVar18._12_4_ = 0x45300000;
    dVar15 = (auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
    pp_Var4 = this[1]._vptr_Tools;
    pp_Var9 = (_func_int **)((long)pp_Var4 - ((long)pp_Var4 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)pp_Var4) {
      auVar17._8_8_ = dVar15;
      auVar17._0_8_ = dVar15;
      lVar10 = 0;
      do {
        auVar18 = divpd(*(undefined1 (*) [16])(this->_vptr_Tools + lVar10),auVar17);
        *(undefined1 (*) [16])(this->_vptr_Tools + lVar10) = auVar18;
        lVar10 = lVar10 + 2;
      } while (lVar10 < (long)pp_Var9);
    }
    if ((long)pp_Var9 < (long)pp_Var4) {
      pp_Var5 = this->_vptr_Tools;
      do {
        pp_Var5[(long)pp_Var9] = (_func_int *)((double)pp_Var5[(long)pp_Var9] / dVar15);
        pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
      } while (pp_Var4 != pp_Var9);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
               (Index)this[1]._vptr_Tools,1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,
               (Index)this[1]._vptr_Tools,1);
    pp_Var4 = this[1]._vptr_Tools;
    pp_Var9 = (_func_int **)((long)pp_Var4 - ((long)pp_Var4 >> 0x3f) & 0xfffffffffffffffe);
    if (1 < (long)pp_Var4) {
      lVar10 = 0;
      auVar18 = extraout_XMM0;
      do {
        auVar18 = sqrtpd(auVar18,*(undefined1 (*) [16])(this->_vptr_Tools + lVar10));
        *(undefined1 (*) [16])(this->_vptr_Tools + lVar10) = auVar18;
        lVar10 = lVar10 + 2;
      } while (lVar10 < (long)pp_Var9);
    }
    DVar11 = extraout_RDX_00;
    if ((long)pp_Var9 < (long)pp_Var4) {
      do {
        p_Var16 = this->_vptr_Tools[(long)pp_Var9];
        if ((double)p_Var16 < 0.0) {
          p_Var16 = (_func_int *)sqrt((double)p_Var16);
          DVar11 = extraout_RDX_01;
        }
        else {
          p_Var16 = (_func_int *)SQRT((double)p_Var16);
        }
        this->_vptr_Tools[(long)pp_Var9] = p_Var16;
        pp_Var9 = (_func_int **)((long)pp_Var9 + 1);
      } while (pp_Var4 != pp_Var9);
    }
  }
  VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar11;
  VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar19.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd Tools::CalculateRMSE(const vector<VectorXd> &estimations,
                              const vector<VectorXd> &ground_truth) {
  /**
    * Calculate the RMSE here.
  */

  VectorXd rmse(4);
  rmse << 0,0,0,0;

  // check the validity of the following inputs:
  //  * the estimation vector size should not be zero
  //  * the estimation vector size should equal ground truth vector size
  if(estimations.size() != ground_truth.size() || estimations.size() == 0){
    std::cout << "Invalid estimation or ground_truth data" << std::endl;
    return rmse;

  }

  //accumulate squared residuals
  for(unsigned int i=0; i < estimations.size(); ++i){

    VectorXd residual = estimations[i] - ground_truth[i];

//Error display
/*
std::cout<<"";
std::cout<<i;
std::cout<<"~Prediction Error (residual):"<<std::endl;
std::cout<<residual<<std::endl;
std::cout<<std::endl;
*/

    //coefficient-wise multiplication
    residual = residual.array()*residual.array();
    rmse += residual;
  }

//calculate the mean
  rmse = rmse/estimations.size();

  //calculate the squared root
  rmse = rmse.array().sqrt();
//return the result of rmse
  return rmse;
}